

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_statistics.cpp
# Opt level: O3

void __thiscall
duckdb::ColumnStatistics::ColumnStatistics(ColumnStatistics *this,BaseStatistics *stats_p)

{
  PhysicalType PVar1;
  DistinctStatistics *this_00;
  
  BaseStatistics::BaseStatistics(&this->stats,stats_p);
  (this->distinct_stats).
  super_unique_ptr<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>_>.
  _M_t.
  super___uniq_ptr_impl<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::DistinctStatistics_*,_std::default_delete<duckdb::DistinctStatistics>_>
  .super__Head_base<0UL,_duckdb::DistinctStatistics_*,_false>._M_head_impl =
       (DistinctStatistics *)0x0;
  PVar1 = (this->stats).type.physical_type_;
  if (((0x1d < PVar1) || ((0x21800002U >> (PVar1 & 0x1f) & 1) == 0)) && (PVar1 != BIT)) {
    this_00 = (DistinctStatistics *)operator_new(0x18);
    DistinctStatistics::DistinctStatistics(this_00);
    ::std::
    __uniq_ptr_impl<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>_>::
    reset((__uniq_ptr_impl<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>_>
           *)&this->distinct_stats,this_00);
    return;
  }
  return;
}

Assistant:

ColumnStatistics::ColumnStatistics(BaseStatistics stats_p) : stats(std::move(stats_p)) {
	if (DistinctStatistics::TypeIsSupported(stats.GetType())) {
		distinct_stats = make_uniq<DistinctStatistics>();
	}
}